

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O1

unique_ptr<pstore::sparse_array<int,_unsigned_long>,_std::default_delete<pstore::sparse_array<int,_unsigned_long>_>_>
 __thiscall
pstore::sparse_array<int,unsigned_long>::make_unique<unsigned_long*,int*>
          (sparse_array<int,unsigned_long> *this,unsigned_long *first_index,
          unsigned_long *last_index,int *first_value,int *last_value)

{
  unsigned_long uVar1;
  sparse_array<int,unsigned_long> *this_00;
  ulong uVar2;
  
  uVar1 = bitmap<unsigned_long*,void>(first_index,last_index);
  uVar2 = 0x10;
  if (uVar1 != 0) {
    uVar2 = POPCOUNT(uVar1) * 4 + 0xc;
  }
  this_00 = (sparse_array<int,unsigned_long> *)operator_new(uVar2);
  sparse_array<unsigned_long*,int*>(this_00,first_index,last_index,first_value,last_value);
  *(sparse_array<int,unsigned_long> **)this = this_00;
  return (__uniq_ptr_data<pstore::sparse_array<int,_unsigned_long>,_std::default_delete<pstore::sparse_array<int,_unsigned_long>_>,_true,_true>
          )(__uniq_ptr_data<pstore::sparse_array<int,_unsigned_long>,_std::default_delete<pstore::sparse_array<int,_unsigned_long>_>,_true,_true>
            )this;
}

Assistant:

auto sparse_array<ValueType, BitmapType>::make_unique (IteratorIdx first_index,
                                                           IteratorIdx last_index,
                                                           IteratorV first_value,
                                                           IteratorV last_value)
        -> std::unique_ptr<sparse_array> {

        return std::unique_ptr<sparse_array<ValueType, BitmapType>>{
            new (first_index, last_index) sparse_array<ValueType, BitmapType> (
                first_index, last_index, first_value, last_value)};
    }